

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall Jupiter::IRC::Client::Channel::User::~User(User *this)

{
  element_type *peVar1;
  
  peVar1 = (this->m_user).super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    peVar1->m_channel_count = peVar1->m_channel_count - 1;
  }
  std::__cxx11::string::~string((string *)&this->m_prefixes);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_user).
              super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

Jupiter::IRC::Client::Channel::User::~User() {
	if (m_user != nullptr)
		--m_user->m_channel_count;
}